

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O2

uint32_t __thiscall pm::Random::integer(Random *this,uint32_t min,uint32_t max)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = max - min;
  if (min <= max) {
    do {
      uVar1 = anon_unknown_0::random();
    } while ((uint)uVar1 < -uVar2 % uVar2);
    return min + (int)((uVar1 & 0xffffffff) % (ulong)uVar2);
  }
  __assert_fail("min <= max",
                "/workspace/llm4binary/github/license_all_cmakelists_25/encelo[P]pmTracer/src/Random.cpp"
                ,0x3d,"uint32_t pm::Random::integer(uint32_t, uint32_t)");
}

Assistant:

uint32_t Random::integer(uint32_t min, uint32_t max)
{
	assert(min <= max);
	return min + boundRandom(state_, increment_, max - min);
}